

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Packing_x86_avx::forward_int8
          (Packing_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint _h;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int _c;
  uint _elempack;
  long lVar21;
  int i;
  int iVar22;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  
  if ((this->super_Packing).use_padding != 0) {
LAB_0046125e:
    iVar15 = Packing::forward(&this->super_Packing,bottom_blob,top_blob,opt);
    return iVar15;
  }
  uVar1 = bottom_blob->elempack;
  uVar18 = (ulong)uVar1;
  _elempack = (this->super_Packing).out_elempack;
  if (uVar1 != _elempack) {
    bVar9 = _elempack != 8;
    bVar10 = uVar1 != 1;
    bVar11 = _elempack != 1;
    bVar12 = uVar1 != 8;
    if ((bVar9 || bVar10) && (bVar11 || bVar12)) goto LAB_0046125e;
    uVar5 = bottom_blob->elemsize;
    iVar15 = bottom_blob->dims;
    iVar2 = bottom_blob->w;
    _h = bottom_blob->h;
    if (iVar15 == 2) {
      uVar8 = (long)(int)(_h * uVar1) / (long)(int)_elempack;
      if ((int)(_h * uVar1) % (int)_elempack == 0) {
        iVar15 = (int)uVar8;
        Mat::create(top_blob,iVar2,iVar15,(ulong)_elempack * (uVar5 / uVar18),_elempack,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if ((!bVar9 && !bVar10) && 0 < iVar15) {
            local_80 = 7;
            local_78 = 6;
            local_48 = 5;
            local_50 = 4;
            local_58 = 3;
            local_60 = 2;
            local_68 = 1;
            local_70 = 0;
            uVar18 = 0;
            do {
              if (0 < iVar2) {
                sVar16 = bottom_blob->elemsize;
                lVar19 = (long)bottom_blob->w;
                lVar17 = top_blob->elemsize * uVar18 * (long)top_blob->w;
                pvVar6 = bottom_blob->data;
                pvVar7 = top_blob->data;
                lVar20 = 0;
                do {
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_70 * lVar19);
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 1) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_68 * lVar19);
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 2) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_60 * lVar19);
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 3) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_58 * lVar19);
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 4) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_50 * lVar19);
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 5) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_48 * lVar19);
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 6) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_78 * lVar19);
                  *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 7) =
                       *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_80 * lVar19);
                  lVar20 = lVar20 + 1;
                } while (iVar2 != (int)lVar20);
              }
              uVar18 = uVar18 + 1;
              local_80 = local_80 + 8;
              local_78 = local_78 + 8;
              local_48 = local_48 + 8;
              local_50 = local_50 + 8;
              local_58 = local_58 + 8;
              local_60 = local_60 + 8;
              local_68 = local_68 + 8;
              local_70 = local_70 + 8;
            } while (uVar18 != (uVar8 & 0xffffffff));
          }
          if ((bVar11 || bVar12) || (int)_h < 1) {
            return 0;
          }
          local_80 = 7;
          local_78 = 6;
          local_48 = 5;
          local_50 = 4;
          local_58 = 3;
          local_60 = 2;
          local_68 = 1;
          local_70 = 0;
          uVar18 = 0;
          do {
            if (0 < iVar2) {
              pvVar6 = top_blob->data;
              sVar16 = top_blob->elemsize;
              lVar19 = (long)top_blob->w;
              lVar17 = bottom_blob->elemsize * uVar18 * (long)bottom_blob->w;
              pvVar7 = bottom_blob->data;
              lVar20 = 0;
              do {
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_70 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17);
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_68 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 1);
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_60 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 2);
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_58 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 3);
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_50 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 4);
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_48 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 5);
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_78 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 6);
                *(undefined1 *)((long)pvVar6 + lVar20 + sVar16 * local_80 * lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 8 + lVar17 + 7);
                lVar20 = lVar20 + 1;
              } while (iVar2 != (int)lVar20);
            }
            uVar18 = uVar18 + 1;
            local_80 = local_80 + 8;
            local_78 = local_78 + 8;
            local_48 = local_48 + 8;
            local_50 = local_50 + 8;
            local_58 = local_58 + 8;
            local_60 = local_60 + 8;
            local_68 = local_68 + 8;
            local_70 = local_70 + 8;
          } while (uVar18 != _h);
          return 0;
        }
        return -100;
      }
    }
    else if (iVar15 == 1) {
      if ((int)(iVar2 * uVar1) % (int)_elempack == 0) {
        if (top_blob != bottom_blob) {
          piVar4 = bottom_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar4 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar4;
          top_blob->allocator = bottom_blob->allocator;
          top_blob->dims = bottom_blob->dims;
          iVar15 = bottom_blob->d;
          top_blob->h = bottom_blob->h;
          top_blob->d = iVar15;
          top_blob->c = bottom_blob->c;
          _elempack = (this->super_Packing).out_elempack;
        }
        iVar15 = (int)(iVar2 * uVar1) / (int)_elempack;
        top_blob->w = iVar15;
        top_blob->cstep = (long)iVar15;
        top_blob->elemsize = (uVar5 / uVar18) * (long)(int)_elempack;
        top_blob->elempack = _elempack;
        return 0;
      }
    }
    else {
      if (1 < iVar15 - 3U) {
        return 0;
      }
      uVar3 = bottom_blob->c;
      if ((int)(uVar3 * uVar1) % (int)_elempack == 0) {
        iVar22 = bottom_blob->d;
        uVar8 = (long)(int)(uVar1 * uVar3) / (long)(int)_elempack;
        sVar16 = (uVar5 / uVar18) * (ulong)_elempack;
        _c = (int)uVar8;
        if (iVar15 == 3) {
          Mat::create(top_blob,iVar2,_h,_c,sVar16,_elempack,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,iVar2,_h,iVar22,_c,sVar16,_elempack,opt->blob_allocator);
        }
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        iVar22 = iVar2 * _h * iVar22;
        if ((!bVar9 && !bVar10) && 0 < _c) {
          lVar17 = 0;
          uVar18 = 0;
          do {
            if (0 < iVar22) {
              lVar19 = top_blob->cstep * top_blob->elemsize * uVar18;
              pvVar6 = top_blob->data;
              lVar20 = bottom_blob->cstep * bottom_blob->elemsize;
              pvVar7 = bottom_blob->data;
              lVar21 = 0;
              do {
                lVar13 = lVar21 + lVar20 * lVar17;
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19) =
                     *(undefined1 *)((long)pvVar7 + lVar21 + lVar20 * lVar17);
                lVar14 = lVar20 + lVar13;
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19 + 1) =
                     *(undefined1 *)((long)pvVar7 + lVar20 + lVar13);
                lVar13 = lVar20 + lVar14;
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19 + 2) =
                     *(undefined1 *)((long)pvVar7 + lVar20 + lVar14);
                lVar14 = lVar20 + lVar13;
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19 + 3) =
                     *(undefined1 *)((long)pvVar7 + lVar20 + lVar13);
                lVar13 = lVar20 + lVar14;
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19 + 4) =
                     *(undefined1 *)((long)pvVar7 + lVar20 + lVar14);
                lVar14 = lVar20 + lVar13;
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19 + 5) =
                     *(undefined1 *)((long)pvVar7 + lVar20 + lVar13);
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19 + 6) =
                     *(undefined1 *)((long)pvVar7 + lVar20 + lVar14);
                *(undefined1 *)((long)pvVar6 + lVar21 * 8 + lVar19 + 7) =
                     *(undefined1 *)((long)pvVar7 + lVar20 * 2 + lVar14);
                lVar21 = lVar21 + 1;
              } while (iVar22 != (int)lVar21);
            }
            uVar18 = uVar18 + 1;
            lVar17 = lVar17 + 8;
          } while (uVar18 != (uVar8 & 0xffffffff));
        }
        if ((bVar11 || bVar12) || (int)uVar3 < 1) {
          return 0;
        }
        lVar17 = 0;
        uVar18 = 0;
        do {
          if (0 < iVar22) {
            lVar19 = top_blob->cstep * top_blob->elemsize;
            pvVar6 = top_blob->data;
            lVar20 = bottom_blob->cstep * bottom_blob->elemsize * uVar18;
            pvVar7 = bottom_blob->data;
            lVar21 = 0;
            do {
              lVar13 = lVar21 + lVar19 * lVar17;
              *(undefined1 *)((long)pvVar6 + lVar21 + lVar19 * lVar17) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20);
              *(undefined1 *)((long)pvVar6 + lVar19 + lVar13) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20 + 1);
              lVar13 = lVar19 + lVar13;
              *(undefined1 *)((long)pvVar6 + lVar19 + lVar13) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20 + 2);
              lVar13 = lVar19 + lVar13;
              *(undefined1 *)((long)pvVar6 + lVar19 + lVar13) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20 + 3);
              lVar13 = lVar19 + lVar13;
              *(undefined1 *)((long)pvVar6 + lVar19 + lVar13) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20 + 4);
              lVar13 = lVar19 + lVar13;
              *(undefined1 *)((long)pvVar6 + lVar19 + lVar13) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20 + 5);
              lVar13 = lVar19 + lVar13;
              *(undefined1 *)((long)pvVar6 + lVar19 + lVar13) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20 + 6);
              *(undefined1 *)((long)pvVar6 + lVar19 * 2 + lVar13) =
                   *(undefined1 *)((long)pvVar7 + lVar21 * 8 + lVar20 + 7);
              lVar21 = lVar21 + 1;
            } while (iVar22 != (int)lVar21);
          }
          uVar18 = uVar18 + 1;
          lVar17 = lVar17 + 8;
        } while (uVar18 != uVar3);
        return 0;
      }
    }
  }
  if (top_blob != bottom_blob) {
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar4 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar4;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar15 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    iVar22 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar15;
    top_blob->h = iVar2;
    top_blob->d = iVar22;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  return 0;
}

Assistant:

int Packing_x86_avx::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;

    if (!pack1to8 && !pack8to1)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i * 8);
                const signed char* r1 = bottom_blob.row<const signed char>(i * 8 + 1);
                const signed char* r2 = bottom_blob.row<const signed char>(i * 8 + 2);
                const signed char* r3 = bottom_blob.row<const signed char>(i * 8 + 3);
                const signed char* r4 = bottom_blob.row<const signed char>(i * 8 + 4);
                const signed char* r5 = bottom_blob.row<const signed char>(i * 8 + 5);
                const signed char* r6 = bottom_blob.row<const signed char>(i * 8 + 6);
                const signed char* r7 = bottom_blob.row<const signed char>(i * 8 + 7);

                signed char* outptr = top_blob.row<signed char>(i);

                int j = 0;
                for (; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i);

                signed char* outptr0 = top_blob.row<signed char>(i * 8);
                signed char* outptr1 = top_blob.row<signed char>(i * 8 + 1);
                signed char* outptr2 = top_blob.row<signed char>(i * 8 + 2);
                signed char* outptr3 = top_blob.row<signed char>(i * 8 + 3);
                signed char* outptr4 = top_blob.row<signed char>(i * 8 + 4);
                signed char* outptr5 = top_blob.row<signed char>(i * 8 + 5);
                signed char* outptr6 = top_blob.row<signed char>(i * 8 + 6);
                signed char* outptr7 = top_blob.row<signed char>(i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const signed char* r0 = bottom_blob.channel(q * 8);
                const signed char* r1 = bottom_blob.channel(q * 8 + 1);
                const signed char* r2 = bottom_blob.channel(q * 8 + 2);
                const signed char* r3 = bottom_blob.channel(q * 8 + 3);
                const signed char* r4 = bottom_blob.channel(q * 8 + 4);
                const signed char* r5 = bottom_blob.channel(q * 8 + 5);
                const signed char* r6 = bottom_blob.channel(q * 8 + 6);
                const signed char* r7 = bottom_blob.channel(q * 8 + 7);

                signed char* outptr = top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* r0 = bottom_blob.channel(q);

                signed char* outptr0 = top_blob.channel(q * 8);
                signed char* outptr1 = top_blob.channel(q * 8 + 1);
                signed char* outptr2 = top_blob.channel(q * 8 + 2);
                signed char* outptr3 = top_blob.channel(q * 8 + 3);
                signed char* outptr4 = top_blob.channel(q * 8 + 4);
                signed char* outptr5 = top_blob.channel(q * 8 + 5);
                signed char* outptr6 = top_blob.channel(q * 8 + 6);
                signed char* outptr7 = top_blob.channel(q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    return 0;
}